

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScenePrivate::QGraphicsScenePrivate(QGraphicsScenePrivate *this)

{
  _Rb_tree_header *p_Var1;
  
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QGraphicsScenePrivate_00821640;
  (this->sceneRect).xp = 0.0;
  (this->sceneRect).yp = 0.0;
  (this->sceneRect).w = 0.0;
  (this->sceneRect).h = 0.0;
  *(undefined8 *)&this->indexMethod = 0;
  *(undefined8 *)((long)&this->index + 4) = 0;
  *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 & 0xfffc0000 | 0x370a2;
  p_Var1 = &(this->updatedRects)._M_t._M_impl.super__Rb_tree_header;
  (this->updatedRects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->updatedRects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->minimumRenderSize = 0.0;
  (this->growingItemsBoundingRect).xp = 0.0;
  (this->growingItemsBoundingRect).yp = 0.0;
  (this->growingItemsBoundingRect).w = 0.0;
  (this->growingItemsBoundingRect).h = 0.0;
  (this->updatedRects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->updatedRects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->updatedRects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  QPainterPath::QPainterPath(&this->selectionArea);
  this->selectionChanging = 0;
  (this->selectedItems).q_hash.d = (Data *)0x0;
  (this->unpolishedItems).d.d = (Data *)0x0;
  (this->unpolishedItems).d.ptr = (QGraphicsItem **)0x0;
  (this->unpolishedItems).d.size = 0;
  (this->topLevelItems).d.d = (Data *)0x0;
  (this->topLevelItems).d.ptr = (QGraphicsItem **)0x0;
  (this->topLevelItems).d.size = 0;
  (this->movingItemsInitialPositions).d = (Data *)0x0;
  (this->scenePosItems).q_hash.d = (Data *)0x0;
  QBrush::QBrush(&this->backgroundBrush);
  QBrush::QBrush(&this->foregroundBrush);
  this->rectAdjust = 2;
  memset(&this->focusItem,0,0x9c);
  (this->cachedItemsUnderMouse).d.d = (Data *)0x0;
  (this->cachedItemsUnderMouse).d.ptr = (QGraphicsItem **)0x0;
  (this->cachedItemsUnderMouse).d.size = 0;
  (this->hoverItems).d.d = (Data *)0x0;
  (this->hoverItems).d.ptr = (QGraphicsItem **)0x0;
  (this->hoverItems).d.size = 0;
  (this->lastSceneMousePos).xp = 0.0;
  (this->lastSceneMousePos).yp = 0.0;
  (this->mouseGrabberButtonDownPos).d.d.ptr =
       (QMapData<std::map<Qt::MouseButton,_QPointF,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPointF>_>_>_>
        *)0x0;
  (this->mouseGrabberButtonDownScenePos).d.d.ptr =
       (QMapData<std::map<Qt::MouseButton,_QPointF,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPointF>_>_>_>
        *)0x0;
  (this->mouseGrabberButtonDownScreenPos).d.d.ptr =
       (QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>
        *)0x0;
  (this->views).d.d = (Data *)0x0;
  (this->views).d.ptr = (QGraphicsView **)0x0;
  (this->views).d.size = 0;
  (this->sceneEventFilters).d.d.ptr =
       (QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
        *)0x0;
  this->style = (QStyle *)0x0;
  QFont::QFont(&this->font);
  QPalette::QPalette(&this->palette);
  QStyleOptionGraphicsItem::QStyleOptionGraphicsItem(&this->styleOptionTmp);
  (this->modalPanels).d.ptr = (QGraphicsItem **)0x0;
  (this->modalPanels).d.size = 0;
  (this->grabbedGestures).d = (Data *)0x0;
  (this->modalPanels).d.d = (Data *)0x0;
  (this->cachedAlreadyDeliveredGestures).d = (Data *)0x0;
  (this->gestureTargets).d = (Data *)0x0;
  (this->cachedTargetItems).d.size = 0;
  (this->cachedItemGestures).d = (Data *)0x0;
  (this->cachedTargetItems).d.d = (Data *)0x0;
  (this->cachedTargetItems).d.ptr = (QGraphicsObject **)0x0;
  (this->sceneCurrentTouchPoints).d.d.ptr =
       (QMapData<std::map<int,_QEventPoint,_std::less<int>,_std::allocator<std::pair<const_int,_QEventPoint>_>_>_>
        *)0x0;
  (this->itemForTouchPointId).d.d.ptr =
       (QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>
        *)0x0;
  return;
}

Assistant:

QGraphicsScenePrivate::QGraphicsScenePrivate()
    : indexMethod(QGraphicsScene::BspTreeIndex),
      index(nullptr),
      lastItemCount(0),
      hasSceneRect(false),
      dirtyGrowingItemsBoundingRect(true),
      updateAll(false),
      calledEmitUpdated(false),
      processDirtyItemsEmitted(false),
      needSortTopLevelItems(true),
      holesInTopLevelSiblingIndex(false),
      topLevelSequentialOrdering(true),
      scenePosDescendantsUpdatePending(false),
      stickyFocus(false),
      hasFocus(false),
      lastMouseGrabberItemHasImplicitMouseGrab(false),
      allItemsIgnoreHoverEvents(true),
      allItemsUseDefaultCursor(true),
      painterStateProtection(true),
      sortCacheEnabled(false),
      allItemsIgnoreTouchEvents(true),
      focusOnTouch(true),
      minimumRenderSize(0.0),
      selectionChanging(0),
      rectAdjust(2),
      focusItem(nullptr),
      lastFocusItem(nullptr),
      passiveFocusItem(nullptr),
      tabFocusFirst(nullptr),
      activePanel(nullptr),
      lastActivePanel(nullptr),
      activationRefCount(0),
      childExplicitActivation(0),
      lastMouseGrabberItem(nullptr),
      dragDropItem(nullptr),
      enterWidget(nullptr),
      lastDropAction(Qt::IgnoreAction),
      style(nullptr)
{
}